

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_vector_column.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>
::Naive_vector_column
          (Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>
           *this,Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>
                 *column,Column_settings *colSettings)

{
  pointer ppEVar1;
  ID_index IVar2;
  pointer bg;
  Field_operators *pFVar3;
  reference ppEVar4;
  Field_operators *pFVar5;
  const_iterator __begin0;
  vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_**,_true>
  local_38;
  
  IVar2 = (column->super_Chain_column_option).pivot_;
  this->super_Column_dimension_option =
       (Column_dimension_option)(column->super_Column_dimension_option).dim_;
  (this->super_Chain_column_option).pivot_ = IVar2;
  (this->super_Chain_column_option).pairedColumn_ =
       (column->super_Chain_column_option).pairedColumn_;
  local_38.m_ptr =
       (Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>
        **)0x0;
  boost::container::
  small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>
  ::small_vector(&this->column_,
                 (column->column_).
                 super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
                 .super_type.m_holder.m_size,(value_type *)&local_38);
  pFVar5 = (Field_operators *)0x0;
  pFVar3 = column->operators_;
  if (colSettings != (Column_settings *)0x0) {
    pFVar3 = pFVar5;
  }
  this->operators_ = pFVar3;
  if (colSettings == (Column_settings *)0x0) {
    colSettings = (Column_settings *)column->entryPool_;
  }
  this->entryPool_ = (Entry_constructor *)colSettings;
  local_38.m_ptr =
       (column->column_).
       super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
       .super_type.m_holder.m_start;
  ppEVar1 = local_38.m_ptr +
            (column->column_).
            super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
            .super_type.m_holder.m_size;
  while (local_38.m_ptr != ppEVar1) {
    ppEVar4 = boost::container::
              vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_**,_true>
              ::operator*(&local_38);
    _update_entry(this,(*ppEVar4)->rowIndex_,(Index)pFVar5);
    pFVar5 = (Field_operators *)(ulong)((Index)pFVar5 + 1);
    boost::container::
    vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_**,_true>
    ::operator++(&local_38);
  }
  return;
}

Assistant:

inline Naive_vector_column<Master_matrix,Support>::Naive_vector_column(const Naive_vector_column& column,
                                                               Column_settings* colSettings)
    : RA_opt(),
      Dim_opt(static_cast<const Dim_opt&>(column)),
      Chain_opt(static_cast<const Chain_opt&>(column)),
      column_(column.column_.size(), nullptr),
      operators_(colSettings == nullptr ? column.operators_ : nullptr),
      entryPool_(colSettings == nullptr ? column.entryPool_ : &(colSettings->entryConstructor))
{
  static_assert(!Master_matrix::Option_list::has_row_access,
                "Simple copy constructor not available when row access option enabled. Please specify the new column "
                "index and the row container.");

  if constexpr (!Master_matrix::Option_list::is_z2) {
    if (colSettings != nullptr) operators_ = &(colSettings->operators);
  }

  Index i = 0;
  for (const Entry* entry : column.column_) {
    if constexpr (Master_matrix::Option_list::is_z2) {
      _update_entry(entry->get_row_index(), i++);
    } else {
      _update_entry(entry->get_element(), entry->get_row_index(), i++);
    }
  }
}